

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF,_true>::Sample_f
          (LayeredBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF,_true> *this,Vector3f wo,Float uc,
          Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  Vector3f w_00;
  Vector3f w_01;
  Vector3f w_02;
  Vector3f w_03;
  undefined1 auVar1 [16];
  Vector3f wo_00;
  Vector3f wo_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector3f wi;
  Vector3f wp;
  Vector3f w_04;
  bool bVar9;
  int iVar10;
  BSDFSample *pBVar11;
  float *pfVar12;
  PhaseFunctionSample *pPVar13;
  int in_ECX;
  DielectricBxDF *in_RSI;
  optional<pbrt::BSDFSample> *in_RDI;
  long *in_FS_OFFSET;
  Float FVar14;
  float fVar15;
  undefined8 uVar17;
  undefined8 uVar18;
  PixelAccumFunc p_Var19;
  undefined1 in_ZMM0 [64];
  undefined1 auVar20 [56];
  float in_XMM1_Da;
  undefined1 in_ZMM3 [64];
  Vector3<float> VVar21;
  Tuple3<pbrt::Vector3,_float> TVar22;
  SampledSpectrum SVar23;
  BxDFReflTransFlags in_stack_000001e4;
  TransportMode in_stack_000001e8;
  Float in_stack_000001ec;
  DielectricBxDF *in_stack_000001f0;
  Point2f in_stack_000001f8;
  Tuple3<pbrt::Vector3,_float> in_stack_00000210;
  BxDFFlags flags;
  optional<pbrt::BSDFSample> bs_1;
  Point2f u_1;
  Float uc_1;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> interface;
  optional<pbrt::PhaseFunctionSample> ps;
  Float zp;
  Float dz;
  Float sigma_t;
  Float q;
  Float rrBeta;
  int depth;
  HGPhaseFunction phase;
  Float z;
  Float pdf;
  SampledSpectrum f;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  bool specularPath;
  Vector3f w;
  optional<pbrt::BSDFSample> bs;
  bool enteredTop;
  bool flipWi;
  float in_stack_fffffffffffff9b8;
  float in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  Float in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  Float in_stack_fffffffffffff9cc;
  float in_stack_fffffffffffff9d0;
  float in_stack_fffffffffffff9d4;
  undefined8 local_628;
  PixelAccumFunc in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined2 in_stack_fffffffffffff9ec;
  undefined1 in_stack_fffffffffffff9ee;
  undefined1 in_stack_fffffffffffff9ef;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  char *in_stack_fffffffffffffa08;
  float in_stack_fffffffffffffa10;
  BxDFReflTransFlags in_stack_fffffffffffffa14;
  BSDFSample *in_stack_fffffffffffffa18;
  BSDFSample *in_stack_fffffffffffffa20;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa40;
  float in_stack_fffffffffffffa44;
  float in_stack_fffffffffffffa48;
  float local_50c;
  Float local_4e4;
  BSDFSample local_37c;
  undefined8 local_350;
  float local_348;
  undefined8 local_33c;
  float local_334;
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  float local_318;
  undefined8 local_310;
  float local_308;
  undefined8 local_300;
  float local_2f8;
  BxDFFlags local_2f4;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  optional local_2bc [48];
  undefined8 local_28c;
  float local_284;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> local_280;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  float local_238;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  optional local_208 [27];
  _lambda_pbrt__StatsAccumulator___1_ local_1ed;
  float local_1ec;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  Float local_1c8;
  undefined4 local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  int local_1b0;
  HGPhaseFunction local_1ac;
  Float local_1a8;
  float local_1a4;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined1 local_140 [23];
  byte local_129;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  int local_f8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  float local_a0;
  optional local_9c [51];
  byte local_69;
  undefined8 local_68;
  float local_60;
  undefined8 local_54;
  float local_4c;
  byte local_45;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  float local_10;
  undefined1 auVar16 [64];
  
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = vmovlpd_avx(in_ZMM3._0_16_);
  local_18 = local_28;
  if (in_ECX != 3) {
    LogFatal<char_const(&)[39]>
              ((LogLevel)((ulong)in_stack_fffffffffffffa20 >> 0x20),
               (char *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,in_stack_fffffffffffffa08
               ,(char (*) [39])CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  }
  local_45 = 0;
  auVar20 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_10 = in_XMM1_Da;
  if (in_XMM1_Da < 0.0) {
    VVar21 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    local_60 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar20;
    local_68 = vmovlpd_avx(auVar16._0_16_);
    local_54 = local_68;
    local_4c = local_60;
    local_18 = local_68;
    local_10 = local_60;
  }
  local_69 = 1;
  local_a0 = local_10;
  local_a8 = local_18;
  local_b0 = local_30;
  local_b8 = local_10;
  local_c0 = local_18;
  local_45 = in_XMM1_Da < 0.0;
  DielectricBxDF::Sample_f
            (in_stack_000001f0,(Vector3f)in_stack_00000210,in_stack_000001ec,in_stack_000001f8,
             in_stack_000001e8,in_stack_000001e4);
  bVar9 = pstd::optional::operator_cast_to_bool(local_9c);
  if (bVar9) {
    pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x88aec6);
    bVar9 = SampledSpectrum::operator_cast_to_bool
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    if (bVar9) {
      pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x88af00)
      ;
      if ((pBVar11->pdf != 0.0) || (NAN(pBVar11->pdf))) {
        pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x88af32);
        fVar15 = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        uVar17 = 0;
        if ((fVar15 != 0.0) || (NAN(fVar15))) {
          pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x88afac);
          bVar9 = BSDFSample::IsReflection((BSDFSample *)0x88afc3);
          if (bVar9) {
            if ((local_45 & 1) != 0) {
              pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x88aff7);
              VVar21 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
              local_110 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar8._8_8_ = uVar17;
              auVar8._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              local_118 = vmovlpd_avx(auVar8);
              local_108 = local_118;
              local_100 = local_110;
              pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x88b075);
              (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_108;
              (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
              (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_100;
            }
            pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                ((optional<pbrt::BSDFSample> *)0x88b0aa);
            pBVar11->pdfIsProportional = true;
            pstd::optional<pbrt::BSDFSample>::optional
                      ((optional<pbrt::BSDFSample> *)
                       CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (optional<pbrt::BSDFSample> *)
                       CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
            local_f8 = 1;
          }
          else {
            pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                ((optional<pbrt::BSDFSample> *)0x88b0f4);
            local_120 = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z;
            local_128._0_4_ = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.x;
            local_128._4_4_ = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.y;
            pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x88b129);
            local_129 = BSDFSample::IsSpecular((BSDFSample *)0x88b140);
            GetOptions();
            local_148 = local_10;
            local_150 = local_18;
            local_158 = local_10;
            local_160 = local_18;
            VVar21.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa10;
            VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffa08;
            Hash<int,pbrt::Vector3<float>>((int)in_stack_fffffffffffff9f0.y,VVar21);
            local_168 = local_30;
            Hash<float,pbrt::Point2<float>>
                      ((float)CONCAT13(in_stack_fffffffffffff9ef,
                                       CONCAT12(in_stack_fffffffffffff9ee,in_stack_fffffffffffff9ec)
                                      ),(Point2<float>)in_stack_fffffffffffff9f0);
            RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),0x88b21d);
            local_170 = local_140;
            pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x88b23c);
            pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                ((optional<pbrt::BSDFSample> *)0x88b263);
            local_198 = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z;
            local_1a0._0_4_ = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.x;
            local_1a0._4_4_ = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.y;
            uVar18 = 0;
            w_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff9d0;
            w_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff9cc;
            w_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9d4;
            local_190 = local_1a0;
            local_188 = local_198;
            AbsCosTheta(w_01);
            uVar17 = 0;
            SVar23 = SampledSpectrum::operator*
                               ((SampledSpectrum *)
                                CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                                in_stack_fffffffffffff9cc);
            auVar6._8_8_ = uVar18;
            auVar6._0_8_ = SVar23.values.values._8_8_;
            auVar7._8_8_ = uVar17;
            auVar7._0_8_ = SVar23.values.values._0_8_;
            local_180 = vmovlpd_avx(auVar7);
            uStack_178 = vmovlpd_avx(auVar6);
            pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                ((optional<pbrt::BSDFSample> *)0x88b326);
            local_1a4 = pBVar11->pdf;
            if ((local_69 & 1) == 0) {
              local_4e4 = 0.0;
            }
            else {
              local_4e4 = in_RSI[2].mfDistrib.alpha_x;
            }
            local_1a8 = local_4e4;
            HGPhaseFunction::HGPhaseFunction(&local_1ac,in_RSI[2].mfDistrib.alpha_y);
            for (local_1b0 = 0; local_1b0 < (int)in_RSI[4].mfDistrib.alpha_x;
                local_1b0 = local_1b0 + 1) {
              FVar14 = SampledSpectrum::MaxComponentValue
                                 ((SampledSpectrum *)
                                  CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
              local_1b4 = FVar14 / local_1a4;
              if ((3 < local_1b0) && (local_1b4 < 0.25)) {
                local_1bc = 0.0;
                local_1c0 = 1.0 - local_1b4;
                pfVar12 = std::max<float>(&local_1bc,&local_1c0);
                local_1b8 = *pfVar12;
                fVar15 = Sample_f::anon_class_8_1_ba1d750b::operator()
                                   ((anon_class_8_1_ba1d750b *)
                                    CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                if (fVar15 < local_1b8) {
                  memset(in_RDI,0,0x30);
                  pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
                  local_f8 = 1;
                  goto LAB_0088c2fc;
                }
                local_1a4 = (1.0 - local_1b8) * local_1a4;
              }
              if ((local_120 == 0.0) && (!NAN(local_120))) {
                memset(in_RDI,0,0x30);
                pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
                local_f8 = 1;
                goto LAB_0088c2fc;
              }
              bVar9 = SampledSpectrum::operator_cast_to_bool
                                ((SampledSpectrum *)
                                 CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
              if (bVar9) {
                local_1c4 = 0x3f800000;
                Sample_f::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                local_1d0 = local_120;
                local_1d8 = local_128;
                local_1e0 = local_120;
                local_1e8 = local_128;
                w_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff9d0;
                w_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff9cc;
                w_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9d4;
                AbsCosTheta(w_02);
                local_1c8 = SampleExponential(0.0,1.2554973e-38);
                if (local_120 <= 0.0) {
                  local_50c = local_1a8 - local_1c8;
                }
                else {
                  local_50c = local_1a8 + local_1c8;
                }
                local_1ec = local_50c;
                if ((LayeredBxDF<pbrt::DielectricBxDF,pbrt::DiffuseBxDF,true>::
                     Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                     ::reg == '\0') && (iVar10 = __cxa_guard_acquire(), iVar10 != 0)) {
                  pbrt::LayeredBxDF::
                  Sample_f(pbrt::Vector3,float,pbrt::Point2,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
                  ::{lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer
                            (&local_1ed);
                  StatRegisterer::StatRegisterer
                            ((StatRegisterer *)in_stack_fffffffffffff9f0,
                             (AccumFunc)
                             CONCAT17(in_stack_fffffffffffff9ef,
                                      CONCAT16(in_stack_fffffffffffff9ee,
                                               CONCAT24(in_stack_fffffffffffff9ec,
                                                        in_stack_fffffffffffff9e8))),
                             in_stack_fffffffffffff9e0);
                  __cxa_guard_release();
                }
                *(long *)(*in_FS_OFFSET + -0x98) = *(long *)(*in_FS_OFFSET + -0x98) + 1;
                if ((local_1ec == local_1a8) && (!NAN(local_1ec) && !NAN(local_1a8))) {
                  *(long *)(*in_FS_OFFSET + -0xa0) = *(long *)(*in_FS_OFFSET + -0xa0) + 1;
                }
                if ((local_1ec == local_1a8) && (!NAN(local_1ec) && !NAN(local_1a8))) {
                  memset(in_RDI,0,0x30);
                  pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
                  local_f8 = 1;
                  goto LAB_0088c2fc;
                }
                if ((local_1ec <= 0.0) || (uVar17 = 0, in_RSI[2].mfDistrib.alpha_x <= local_1ec)) {
                  local_1a8 = Clamp<float,int,float>(local_1ec,0,in_RSI[2].mfDistrib.alpha_x);
                  goto LAB_0088bc40;
                }
                VVar21 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                local_220 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar5._8_8_ = uVar17;
                auVar5._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_228 = vmovlpd_avx(auVar5);
                local_218 = local_228;
                local_210 = local_220;
                Sample_f::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                Sample_f::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                Point2<float>::Point2
                          ((Point2<float> *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8);
                local_238 = local_210;
                local_240 = local_218;
                wo_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffa44;
                wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa40;
                wo_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa48;
                HGPhaseFunction::Sample_p
                          ((HGPhaseFunction *)in_stack_fffffffffffffa20,wo_00,
                           (Point2f)in_stack_fffffffffffffa28);
                bVar9 = pstd::optional::operator_cast_to_bool(local_208);
                if (bVar9) {
                  pPVar13 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                      ((optional<pbrt::PhaseFunctionSample> *)0x88b911);
                  if ((pPVar13->pdf == 0.0) && (!NAN(pPVar13->pdf))) goto LAB_0088b966;
                  pPVar13 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                      ((optional<pbrt::PhaseFunctionSample> *)0x88b943);
                  fVar15 = (pPVar13->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  uVar17 = 0;
                  if ((fVar15 == 0.0) && (!NAN(fVar15))) goto LAB_0088b966;
                  pstd::optional<pbrt::PhaseFunctionSample>::operator->
                            ((optional<pbrt::PhaseFunctionSample> *)0x88b9de);
                  uVar18 = 0;
                  SVar23 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9cc);
                  auVar3._8_8_ = uVar17;
                  auVar3._0_8_ = SVar23.values.values._8_8_;
                  auVar4._8_8_ = uVar18;
                  auVar4._0_8_ = SVar23.values.values._0_8_;
                  local_250 = vmovlpd_avx(auVar4);
                  local_248 = vmovlpd_avx(auVar3);
                  SampledSpectrum::operator*=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                             (SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
                  pPVar13 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                      ((optional<pbrt::PhaseFunctionSample> *)0x88ba5d);
                  local_1a4 = local_1a4 * pPVar13->pdf;
                  local_129 = 0;
                  pPVar13 = pstd::optional<pbrt::PhaseFunctionSample>::operator->
                                      ((optional<pbrt::PhaseFunctionSample> *)0x88ba9f);
                  local_128._0_4_ = (pPVar13->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                  local_128._4_4_ = (pPVar13->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                  local_120 = (pPVar13->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  local_1a8 = local_1ec;
                  local_f8 = 4;
                }
                else {
LAB_0088b966:
                  memset(in_RDI,0,0x30);
                  pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
                  local_f8 = 1;
                }
                pstd::optional<pbrt::PhaseFunctionSample>::~optional
                          ((optional<pbrt::PhaseFunctionSample> *)0x88baf1);
                if (local_f8 != 4) goto LAB_0088c2fc;
              }
              else {
                fVar15 = in_RSI[2].mfDistrib.alpha_x;
                if ((local_1a8 != fVar15) || (NAN(local_1a8) || NAN(fVar15))) {
                  local_1a8 = in_RSI[2].mfDistrib.alpha_x;
                }
                else {
                  local_1a8 = 0.0;
                }
                local_258 = local_120;
                local_260 = local_128;
                local_268 = local_120;
                local_270 = local_128;
                w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff9cc;
                w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff9c8;
                w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9d0;
                Tr(0.0,w_00);
                SampledSpectrum::operator*=
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                           in_stack_fffffffffffff9cc);
LAB_0088bc40:
                TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::TopOrBottomBxDF
                          (&local_280);
                if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
                  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=
                            (&local_280,in_RSI);
                }
                else {
                  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=
                            (&local_280,(DiffuseBxDF *)(in_RSI + 1));
                }
                local_284 = Sample_f::anon_class_8_1_ba1d750b::operator()
                                      ((anon_class_8_1_ba1d750b *)
                                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                                      );
                Sample_f::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                Sample_f::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                uVar17 = 0;
                Point2<float>::Point2
                          ((Point2<float> *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8);
                VVar21 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
                in_stack_fffffffffffffa44 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
                in_stack_fffffffffffffa48 = VVar21.super_Tuple3<pbrt::Vector3,_float>.x;
                auVar2._8_8_ = uVar17;
                auVar2._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_2f0 = vmovlpd_avx(auVar2);
                local_2e0 = local_28c;
                wo_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffa44;
                wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa40;
                wo_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa48;
                local_2e8 = in_stack_fffffffffffffa44;
                local_2d8 = local_2f0;
                local_2d0 = in_stack_fffffffffffffa44;
                local_2c8 = local_2f0;
                local_2c0 = in_stack_fffffffffffffa44;
                TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Sample_f
                          ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                           in_stack_fffffffffffffa20,wo_01,
                           (Float)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                           (Point2f)in_stack_fffffffffffffa28,
                           (TransportMode)in_stack_fffffffffffffa18,in_stack_fffffffffffffa14);
                bVar9 = pstd::optional::operator_cast_to_bool(local_2bc);
                in_stack_fffffffffffffa40 = CONCAT13(bVar9,(int3)in_stack_fffffffffffffa40);
                if (bVar9) {
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x88be1e);
                  bVar9 = SampledSpectrum::operator_cast_to_bool
                                    ((SampledSpectrum *)
                                     CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
                  if (!bVar9) goto LAB_0088be9b;
                  in_stack_fffffffffffffa28 =
                       (Tuple2<pbrt::Point2,_float>)
                       pstd::optional<pbrt::BSDFSample>::operator->
                                 ((optional<pbrt::BSDFSample> *)0x88be52);
                  if ((*(Float *)((long)in_stack_fffffffffffffa28 + 0x1c) == 0.0) &&
                     (!NAN(*(Float *)((long)in_stack_fffffffffffffa28 + 0x1c)))) goto LAB_0088be9b;
                  in_stack_fffffffffffffa20 =
                       pstd::optional<pbrt::BSDFSample>::operator->
                                 ((optional<pbrt::BSDFSample> *)0x88be7e);
                  fVar15 = (in_stack_fffffffffffffa20->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  if ((fVar15 == 0.0) && (!NAN(fVar15))) goto LAB_0088be9b;
                  in_stack_fffffffffffffa18 =
                       pstd::optional<pbrt::BSDFSample>::operator->
                                 ((optional<pbrt::BSDFSample> *)0x88beff);
                  SampledSpectrum::operator*=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                             (SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
                  pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                      ((optional<pbrt::BSDFSample> *)0x88bf27);
                  in_stack_fffffffffffffa14 = (BxDFReflTransFlags)((ulong)pBVar11 >> 0x20);
                  local_1a4 = local_1a4 * pBVar11->pdf;
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x88bf5b);
                  bVar9 = BSDFSample::IsSpecular((BSDFSample *)0x88bf6c);
                  local_129 = bVar9 & local_129;
                  pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                      ((optional<pbrt::BSDFSample> *)0x88bf99);
                  local_120 = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  local_128._0_4_ = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                  local_128._4_4_ = (pBVar11->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                  in_stack_fffffffffffff9f0 =
                       (Tuple2<pbrt::Point2,_float>)
                       pstd::optional<pbrt::BSDFSample>::operator->
                                 ((optional<pbrt::BSDFSample> *)0x88bfc8);
                  in_stack_fffffffffffff9ef = BSDFSample::IsTransmission((BSDFSample *)0x88bfd9);
                  if ((bool)in_stack_fffffffffffff9ef) {
                    local_2f8 = local_10;
                    local_300 = local_18;
                    local_308 = local_120;
                    local_310 = local_128;
                    local_318 = local_10;
                    local_320 = local_18;
                    w_04.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
                    w_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
                    w_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
                    local_328 = local_120;
                    local_330 = local_128;
                    wp.super_Tuple3<pbrt::Vector3,_float>.z = local_120;
                    wp.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_128;
                    wp.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_128._4_4_;
                    p_Var19 = (PixelAccumFunc)0x0;
                    in_stack_fffffffffffff9ee = SameHemisphere(w_04,wp);
                    local_2f4 = Transmission - (byte)in_stack_fffffffffffff9ee;
                    operator|=(&local_2f4,(local_129 & 1) * 8 + Glossy);
                    TVar22.z = in_stack_fffffffffffff9d4;
                    TVar22.x = (float)(undefined4)local_628;
                    TVar22.y = (float)local_628._4_4_;
                    if ((local_45 & 1) != 0) {
                      TVar22 = (Tuple3<pbrt::Vector3,_float>)
                               Tuple3<pbrt::Vector3,_float>::operator-
                                         ((Tuple3<pbrt::Vector3,_float> *)
                                          CONCAT44(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0));
                      local_348 = TVar22.z;
                      auVar1._8_8_ = p_Var19;
                      auVar1._0_8_ = TVar22._0_8_;
                      local_350 = vmovlpd_avx(auVar1);
                      in_stack_fffffffffffff9e0 = p_Var19;
                      local_33c = local_350;
                      local_334 = local_348;
                      local_128 = local_350;
                      local_120 = local_348;
                    }
                    in_stack_fffffffffffff9d4 = TVar22.z;
                    local_628 = TVar22._0_8_;
                    SVar23.values.values[2] = (float)(undefined4)uStack_178;
                    SVar23.values.values[3] = (float)uStack_178._4_4_;
                    SVar23.values.values[0] = (float)(undefined4)local_180;
                    SVar23.values.values[1] = (float)local_180._4_4_;
                    wi.super_Tuple3<pbrt::Vector3,_float>.z = local_120;
                    wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_128;
                    wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_128._4_4_;
                    BSDFSample::BSDFSample(&local_37c,SVar23,wi,local_1a4,local_2f4,1.0,true);
                    pstd::optional<pbrt::BSDFSample>::optional
                              ((optional<pbrt::BSDFSample> *)
                               CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                               (BSDFSample *)
                               CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
                    local_f8 = 1;
                  }
                  else {
                    pBVar11 = pstd::optional<pbrt::BSDFSample>::operator->
                                        ((optional<pbrt::BSDFSample> *)0x88c21f);
                    in_stack_fffffffffffff9c8 = SUB84(pBVar11,0);
                    in_stack_fffffffffffff9cc = (Float)((ulong)pBVar11 >> 0x20);
                    w_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff9d0;
                    w_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff9cc;
                    w_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9d4;
                    in_stack_fffffffffffff9c4 = AbsCosTheta(w_03);
                    SampledSpectrum::operator*=
                              ((SampledSpectrum *)
                               CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                               in_stack_fffffffffffff9cc);
                    local_f8 = 0;
                  }
                }
                else {
LAB_0088be9b:
                  memset(in_RDI,0,0x30);
                  pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
                  local_f8 = 1;
                }
                pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x88c2ab);
                if (local_f8 != 0) goto LAB_0088c2fc;
              }
            }
            memset(in_RDI,0,0x30);
            pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
            local_f8 = 1;
          }
          goto LAB_0088c2fc;
        }
      }
    }
  }
  memset(in_RDI,0,0x30);
  pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
  local_f8 = 1;
LAB_0088c2fc:
  pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x88c309);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSDFSample> Sample_f(
        Vector3f wo, Float uc, Point2f u, TransportMode mode,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wo_ for layered BSDF sampling
        bool flipWi = false;
        if (twoSided && wo.z < 0) {
            wo = -wo;
            flipWi = true;
        }

        // Sample BSDF at entrance interface to get initial direction _w_
        bool enteredTop = twoSided || wo.z > 0;
        pstd::optional<BSDFSample> bs =
            enteredTop ? top.Sample_f(wo, uc, u, mode) : bottom.Sample_f(wo, uc, u, mode);
        if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
            return {};
        if (bs->IsReflection()) {
            if (flipWi)
                bs->wi = -bs->wi;
            bs->pdfIsProportional = true;
            return bs;
        }
        Vector3f w = bs->wi;
        bool specularPath = bs->IsSpecular();

        // Declare _RNG_ for layered BSDF sampling
        RNG rng(Hash(GetOptions().seed, wo), Hash(uc, u));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Declare common variables for layered BSDF sampling
        SampledSpectrum f = bs->f * AbsCosTheta(bs->wi);
        Float pdf = bs->pdf;
        Float z = enteredTop ? thickness : 0;
        HGPhaseFunction phase(g);

        for (int depth = 0; depth < maxDepth; ++depth) {
            // Follow random walk through layers to sample layered BSDF
            // Possibly terminate layered BSDF sampling with Russian Roulette
            Float rrBeta = f.MaxComponentValue() / pdf;
            if (depth > 3 && rrBeta < 0.25f) {
                Float q = std::max<Float>(0, 1 - rrBeta);
                if (r() < q)
                    return {};
                pdf *= 1 - q;
            }
            if (w.z == 0)
                return {};

            if (albedo) {
                // Sample potential scattering event in layered medium
                Float sigma_t = 1;
                Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                Float zp = w.z > 0 ? (z + dz) : (z - dz);
                CHECK_RARE(1e-5, zp == z);
                if (zp == z)
                    return {};
                if (0 < zp && zp < thickness) {
                    // Update path state for valid scattering event between interfaces
                    pstd::optional<PhaseFunctionSample> ps =
                        phase.Sample_p(-w, Point2f(r(), r()));
                    if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                        return {};
                    f *= albedo * ps->p;
                    pdf *= ps->pdf;
                    specularPath = false;
                    w = ps->wi;
                    z = zp;

                    continue;
                }
                z = Clamp(zp, 0, thickness);
                if (z == 0)
                    DCHECK_LT(w.z, 0);
                else
                    DCHECK_GT(w.z, 0);

            } else {
                // Advance to the other layer interface
                z = (z == thickness) ? 0 : thickness;
                f *= Tr(thickness, w);
            }
            // Initialize _interface_ for current interface surface
#ifdef interface  // That's enough out of you, Windows.
#undef interface
#endif
            TopOrBottomBxDF<TopBxDF, BottomBxDF> interface;
            if (z == 0)
                interface = &bottom;
            else
                interface = &top;

            // Sample interface BSDF to determine new path direction
            Float uc = r();
            Point2f u(r(), r());
            pstd::optional<BSDFSample> bs = interface.Sample_f(-w, uc, u, mode);
            if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                return {};
            f *= bs->f;
            pdf *= bs->pdf;
            specularPath &= bs->IsSpecular();
            w = bs->wi;

            // Return _BSDFSample_ if path has left the layers
            if (bs->IsTransmission()) {
                BxDFFlags flags = SameHemisphere(wo, w) ? BxDFFlags::Reflection
                                                        : BxDFFlags::Transmission;
                flags |= specularPath ? BxDFFlags::Specular : BxDFFlags::Glossy;
                if (flipWi)
                    w = -w;
                return BSDFSample(f, w, pdf, flags, 1.f, true);
            }

            // Scale _f_ by cosine term after scattering at the interface
            f *= AbsCosTheta(bs->wi);
        }
        return {};
    }